

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TscClock.cpp
# Opt level: O2

int main(void)

{
  ulong uVar1;
  cx_string<2UL> cVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  __atomic_base<unsigned_long> _Var3;
  undefined4 uVar4;
  bool bVar5;
  allocator local_48d;
  allocator local_48c;
  allocator local_48b;
  allocator local_48a;
  allocator local_489;
  int local_488;
  undefined2 local_484;
  char local_482;
  string local_480;
  SessionWriter writer;
  ConsumeResult local_430;
  undefined1 local_410 [48];
  string local_3e0 [32];
  string local_3c0 [32];
  uint64_t local_3a0;
  string local_398 [32];
  string local_378 [32];
  Session session;
  ClockSync tscSync;
  ClockSync systemClockSync;
  ofstream logfile;
  byte abStack_210 [480];
  
  std::ofstream::ofstream(&logfile,"tscclock.blog",_S_out|_S_bin);
  binlog::Session::Session(&session);
  uVar1 = rdtsc();
  binlog::systemClockSync();
  tscSync.clockValue = CONCAT44(extraout_var,(int)uVar1) | uVar1 & 0xffffffff00000000;
  tscSync.clockFrequency = 3000000000;
  tscSync.nsSinceEpoch = systemClockSync.nsSinceEpoch;
  tscSync.tzOffset = systemClockSync.tzOffset;
  std::__cxx11::string::string((string *)&tscSync.tzName,(string *)&systemClockSync.tzName);
  binlog::Session::setClockSync(&session,&tscSync);
  local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
  local_480._M_string_length = 0;
  local_480.field_2._M_local_buf[0] = '\0';
  binlog::SessionWriter::SessionWriter(&writer,&session,0x100000,0,&local_480);
  std::__cxx11::string::~string((string *)&local_480);
  uVar4 = extraout_var_00;
  if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
    local_410._0_8_ = 0;
    local_410._8_2_ = info;
    std::__cxx11::string::string((string *)(local_410 + 0x10),"main",&local_489);
    std::__cxx11::string::string(local_3e0,"main",&local_48a);
    std::__cxx11::string::string
              (local_3c0,
               "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/example/TscClock.cpp"
               ,&local_48b);
    local_3a0 = 0x3f;
    std::__cxx11::string::string(local_398,"a={}, b={}",&local_48c);
    local_430.bytesConsumed._0_4_ = 0x7b;
    local_488 = 0x1c8;
    cVar2 = binlog::detail::concatenated_tags<char_const(&)[11],int,int>
                      ((char (*) [11])"a={}, b={}",(int *)&local_430,&local_488);
    local_484 = cVar2._data._0_2_;
    local_482 = cVar2._data[2];
    std::__cxx11::string::string(local_378,(char *)&local_484,&local_48d);
    _Var3._M_i = binlog::Session::addEventSource(writer._session,(EventSource *)local_410);
    binlog::EventSource::~EventSource((EventSource *)local_410);
    LOCK();
    uVar4 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i._4_4_;
    UNLOCK();
    main::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
         (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var3._M_i;
  }
  uVar1 = rdtsc();
  local_430.bytesConsumed._0_4_ = 0x7b;
  local_488 = 0x1c8;
  binlog::SessionWriter::addEvent<int,int>
            (&writer,(uint64_t)main::_binlog_sid.super___atomic_base<unsigned_long>._M_i,
             uVar1 & 0xffffffff00000000 | CONCAT44(uVar4,(int)uVar1),(int *)&local_430,&local_488);
  binlog::Session::consume<std::ofstream>(&local_430,&session,&logfile);
  bVar5 = (abStack_210[*(long *)(_logfile + -0x18)] & 5) == 0;
  if (bVar5) {
    std::operator<<((ostream *)&std::cout,"Binary log written to tscclock.blog\n");
  }
  else {
    std::operator<<((ostream *)&std::cerr,"Failed to write tscclock.blog\n");
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&writer._channel.
              super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)&tscSync.tzName);
  std::__cxx11::string::~string((string *)&systemClockSync.tzName);
  binlog::Session::~Session(&session);
  std::ofstream::~ofstream(&logfile);
  return (uint)!bVar5;
}

Assistant:

int main()
{
  std::ofstream logfile("tscclock.blog", std::ofstream::out|std::ofstream::binary);

  binlog::Session session;

  // Create a ClockSync, that connects the TSC value to the wall clock time.
  const auto tscValue = __rdtsc();
  const binlog::ClockSync systemClockSync = binlog::systemClockSync();
  const binlog::ClockSync tscSync{
    tscValue,
    tscFrequency(),
    systemClockSync.nsSinceEpoch,
    systemClockSync.tzOffset,
    systemClockSync.tzName
  };

  // Add the created ClockSync to the metadata of the session.
  // Events consumed after this are assumed to be timestamped
  // with the clock defined by the ClockSync (this case, TSC)
  session.setClockSync(tscSync);

  // Add one event, consume the writer queue...

  binlog::SessionWriter writer(session);
  TSC_INFO_W(writer, "a={}, b={}", 123, 456);

  session.consume(logfile);

  if (! logfile)
  {
    std::cerr << "Failed to write tscclock.blog\n";
    return 1;
  }

  std::cout << "Binary log written to tscclock.blog\n";
  return 0;
}